

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Visible_Animator_Do_proc(Am_Object *interp)

{
  Am_Value *pAVar1;
  Am_Object sub_animator;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  pAVar1 = Am_Object::Get(interp,0x108,0);
  Am_Object::Am_Object(&local_20,pAVar1);
  pAVar1 = Am_Object::Get(interp,0x109,0);
  Am_Object::Set(&local_20,0x169,pAVar1,0);
  Am_Object::Am_Object(&local_10,&local_20);
  Am_Set_Animated_Slots(&local_10);
  Am_Object::~Am_Object(&local_10);
  pAVar1 = Am_Object::Get(interp,0x182,0);
  Am_Object::Set(interp,0x169,pAVar1,0);
  Am_Object::Am_Object(&local_18,interp);
  Am_Set_Animated_Slots(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Visible_Animator_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Visible Stop of " << interp);

  Am_Object sub_animator = interp.Get(Am_SUB_ANIMATOR);

  // restore object's original position
  sub_animator.Set(Am_VALUE, interp.Get(Am_VISIBLE_LOCATION));
  Am_Set_Animated_Slots(sub_animator);

  // and assert the final visibility value
  interp.Set(Am_VALUE, interp.Get(Am_VALUE_2));
  Am_Set_Animated_Slots(interp);
}